

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicNull_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicNull_Test *this)

{
  bool bVar1;
  int *piVar2;
  Fixed *pFVar3;
  char *pcVar4;
  AssertionHelper local_7c8;
  Fixed local_798;
  undefined1 local_610 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_5e0 [4];
  int x_3;
  Fixed local_5b0;
  undefined1 local_428 [8];
  AssertionResult iutest_ar_2;
  undefined1 local_3f8 [4];
  int x_2;
  Fixed local_3c8;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  int x_1;
  Fixed local_1e0;
  undefined1 local_48 [8];
  AssertionResult iutest_ar;
  int x;
  int *p;
  iu_SyntaxTest_x_iutest_x_VariadicNull_Test *this_local;
  
  iutest_ar._36_4_ = 1;
  iutest::detail::AlwaysZero();
  piVar2 = T<0,0>::call<int*>((int *)0x0);
  iutest::internal::NullHelper<false>::CompareEq<int>
            ((AssertionResult *)local_48,"(T<0, 0>::call(p))",piVar2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_1e0,iutest_ar._36_4_);
    pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_48);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&x_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x174,pcVar4,kFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&x_1,pFVar3);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&x_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (iutest_ar_1._36_4_ == 0) {
    iutest_ar_1.m_result = true;
    iutest_ar_1._33_3_ = 0;
    iutest::detail::AlwaysZero();
    piVar2 = T<0,0>::call<int*>((int *)0x0);
    iutest::internal::NullHelper<false>::CompareEq<int>
              ((AssertionResult *)local_240,"(T<0, 0>::call(p))",piVar2);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_3c8,iutest_ar_1._32_4_);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x176,pcVar4,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_3f8,pFVar3);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_3f8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    iutest_ar_2._36_4_ = 1;
    iutest::detail::AlwaysZero();
    piVar2 = T<0,0>::call<int*>((int *)0x0);
    iutest::internal::NullHelper<false>::CompareEq<int>
              ((AssertionResult *)local_428,"(T<0, 0>::call(p))",piVar2);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      memset(&local_5b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5b0);
      pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_5b0,iutest_ar_2._36_4_);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_428);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)local_5e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x178,pcVar4,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)local_5e0,pFVar3);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)local_5e0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5b0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    iutest_ar_3._36_4_ = 1;
    iutest::detail::AlwaysZero();
    piVar2 = T<0,0>::call<int*>((int *)0x0);
    iutest::internal::NullHelper<false>::CompareEq<int>
              ((AssertionResult *)local_610,"(T<0, 0>::call(p))",piVar2);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
    if (!bVar1) {
      memset(&local_798,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_798);
      pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_798,iutest_ar_3._36_4_);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_610);
      iutest::AssertionHelper::AssertionHelper
                (&local_7c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x17a,pcVar4,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7c8,pFVar3);
      iutest::AssertionHelper::~AssertionHelper(&local_7c8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_798);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicNull)
{
    int* p = NULL;
    if( int x = 1 )
        IUTEST_ASSERT_NULL(T<0, 0>::call(p)) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NULL(T<0, 0>::call(p)) << x;
    if( int x = 1 )
        IUTEST_INFORM_NULL(T<0, 0>::call(p)) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NULL(T<0, 0>::call(p)) << x;
}